

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Student *pSVar11;
  Student *pSVar12;
  size_t sVar13;
  ostream *poVar14;
  int i;
  long lVar15;
  Student *pSVar16;
  int j;
  long lVar17;
  long lVar18;
  int iVar19;
  int n;
  value_type __val;
  int local_5c;
  char local_58 [16];
  int local_48 [2];
  int aiStack_40 [4];
  
  __isoc99_scanf("%d",&local_5c);
  if (0 < local_5c) {
    lVar18 = 0x104090;
    lVar17 = 0;
    do {
      __isoc99_scanf("%s",stu + lVar17);
      lVar15 = 0;
      do {
        __isoc99_scanf("%d",lVar18 + lVar15);
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x10);
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar17 < local_5c);
  }
  lVar17 = 0x104090;
  pSVar11 = stu + 1;
  pSVar16 = stu;
  do {
    pSVar12 = pSVar11;
    if (stu[0].socre[3] + stu[0].socre[1] + stu[0].socre[2] + stu[0].socre[0] <
        pSVar12->socre[3] + pSVar12->socre[1] + pSVar12->socre[2] + pSVar12->socre[0]) {
      local_58._0_8_ = *(undefined8 *)pSVar12->name;
      local_58._8_8_ = *(undefined8 *)(pSVar12->name + 8);
      local_48 = *(int (*) [2])pSVar12->socre;
      aiStack_40._0_8_ = *(undefined8 *)(pSVar12->socre + 2);
      memmove((void *)((long)pSVar16 + (0x40 - (long)(pSVar12 + -0x8204))),stu,
              (size_t)(pSVar12 + -0x8204));
      stu[0].name[0] = local_58[0];
      stu[0].name[1] = local_58[1];
      stu[0].name[2] = local_58[2];
      stu[0].name[3] = local_58[3];
      stu[0].name[4] = local_58[4];
      stu[0].name[5] = local_58[5];
      stu[0].name[6] = local_58[6];
      stu[0].name[7] = local_58[7];
      stu[0].name[8] = local_58[8];
      stu[0].name[9] = local_58[9];
      stu[0].name[10] = local_58[10];
      stu[0].name[0xb] = local_58[0xb];
      stu[0].name[0xc] = local_58[0xc];
      stu[0].name[0xd] = local_58[0xd];
      stu[0].name[0xe] = local_58[0xe];
      stu[0]._15_1_ = local_58[0xf];
      stu[0].socre[0] = local_48[0];
      stu[0].socre[1] = local_48[1];
      stu[0].socre[2] = aiStack_40[0];
      stu[0].socre[3] = aiStack_40[1];
    }
    else {
      local_58._0_8_ = *(undefined8 *)pSVar12->name;
      local_58._8_8_ = *(undefined8 *)(pSVar12->name + 8);
      iVar1 = pSVar12->socre[0];
      iVar2 = pSVar12->socre[1];
      iVar3 = pSVar12->socre[2];
      iVar4 = pSVar12->socre[3];
      pSVar11 = pSVar12;
      for (iVar19 = pSVar12[-1].socre[3] + pSVar12[-1].socre[1] +
                    pSVar12[-1].socre[2] + pSVar12[-1].socre[0];
          iVar19 < iVar4 + iVar2 + iVar3 + iVar1; iVar19 = iVar7 + iVar5 + iVar6 + iVar19) {
        iVar19 = pSVar11[-2].socre[0];
        iVar5 = pSVar11[-2].socre[1];
        iVar6 = pSVar11[-2].socre[2];
        iVar7 = pSVar11[-2].socre[3];
        uVar8 = *(undefined8 *)pSVar11[-1].name;
        uVar9 = *(undefined8 *)(pSVar11[-1].name + 8);
        uVar10 = *(undefined8 *)(pSVar11[-1].socre + 2);
        *(undefined8 *)pSVar11->socre = *(undefined8 *)pSVar11[-1].socre;
        *(undefined8 *)(pSVar11->socre + 2) = uVar10;
        *(undefined8 *)pSVar11->name = uVar8;
        *(undefined8 *)(pSVar11->name + 8) = uVar9;
        pSVar11 = pSVar11 + -1;
      }
      *(undefined8 *)pSVar11->name = local_58._0_8_;
      *(undefined8 *)(pSVar11->name + 8) = local_58._8_8_;
      pSVar11->socre[0] = iVar1;
      pSVar11->socre[1] = iVar2;
      pSVar11->socre[2] = iVar3;
      pSVar11->socre[3] = iVar4;
    }
    pSVar11 = pSVar12 + 1;
    pSVar16 = pSVar12;
  } while (pSVar12 + 1 != stu + 5);
  lVar18 = 0;
  do {
    sVar13 = strlen(stu[lVar18].name);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,stu[lVar18].name,sVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    lVar15 = 0;
    do {
      poVar14 = (ostream *)
                std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar17 + lVar15 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    lVar18 = lVar18 + 1;
    lVar17 = lVar17 + 0x20;
  } while (lVar18 != 4);
  return 0;
}

Assistant:

int main() {
    int n;
    scanf("%d",&n);
    for (int i = 0; i < n; ++i) {
    scanf("%s",&stu[i].name);
        for (int j = 0; j < 4; ++j) {
            scanf("%d", &stu[i].socre[j]);
        }
    }
    sort(stu,stu+(4+1),cmp);    //尾地址要往后面走一位,因为地址0-4，一共有5个，所有尾地址填 5。
    for (int i = 0; i < 4; ++i) {
        cout << stu[i].name << " ";
        for (int j = 0; j < 4; ++j) {
            cout << stu[i].socre[j] << " ";
        }
        cout << "\n";
    }
    return 0;
}